

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O2

void aom_dc_predictor_8x32_c(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  dc_predictor_rect(dst,stride,8,0x20,above,left,3,0x3334);
  return;
}

Assistant:

void aom_dc_predictor_8x32_c(uint8_t *dst, ptrdiff_t stride,
                             const uint8_t *above, const uint8_t *left) {
  dc_predictor_rect(dst, stride, 8, 32, above, left, 3, DC_MULTIPLIER_1X4);
}